

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void * __thiscall MixedArena::allocSpace(MixedArena *this,size_t size,size_t align)

{
  pthread_t pVar1;
  iterator __position;
  void *pvVar2;
  size_t sVar3;
  pthread_t pVar4;
  __pointer_type this_00;
  __pointer_type pMVar5;
  pointer ppvVar6;
  ulong uVar7;
  bool bVar8;
  void *local_40;
  size_t local_38;
  
  local_38 = size;
  pVar4 = pthread_self();
LAB_001592d5:
  do {
    do {
      sVar3 = local_38;
      pVar1 = (this->threadId)._M_thread;
      if (pVar4 == pVar1) {
        uVar7 = -align & (this->index + align) - 1;
        this->index = uVar7;
        if ((0x8000 < uVar7 + local_38) ||
           (ppvVar6 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish,
           ppvVar6 ==
           (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_start)) {
          if ((local_38 + 0x7fff & 0xffffffffffff8000) < local_38) {
            __assert_fail("size <= numChunks * CHUNK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0x7e,"void *MixedArena::allocSpace(size_t, size_t)");
          }
          local_40 = (void *)aligned_alloc(0x10);
          if (local_40 == (void *)0x0) {
            abort();
          }
          __position._M_current =
               (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                      ((vector<void*,std::allocator<void*>> *)this,__position,&local_40);
            ppvVar6 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          else {
            *__position._M_current = local_40;
            ppvVar6 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
            (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish = ppvVar6;
          }
          uVar7 = 0;
        }
        pvVar2 = ppvVar6[-1];
        this->index = sVar3 + uVar7;
        return (void *)((long)pvVar2 + uVar7);
      }
    } while (pVar4 == pVar1);
    this_00 = (__pointer_type)0x0;
    do {
      pMVar5 = (this->next)._M_b._M_p;
      if (pMVar5 == (__pointer_type)0x0) {
        if (this_00 == (__pointer_type)0x0) {
          this_00 = (__pointer_type)operator_new(0x30);
          (this_00->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (this_00->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (this_00->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_00->index = 0;
          (this_00->threadId)._M_thread = pVar4;
          LOCK();
          (this_00->next)._M_b._M_p = (__pointer_type)0x0;
          UNLOCK();
        }
        LOCK();
        pMVar5 = (this->next)._M_b._M_p;
        bVar8 = pMVar5 == (__pointer_type)0x0;
        if (bVar8) {
          (this->next)._M_b._M_p = this_00;
          pMVar5 = (__pointer_type)0x0;
        }
        UNLOCK();
        if (bVar8) goto LAB_001592d5;
      }
      this = pMVar5;
    } while (pVar4 != (this->threadId)._M_thread);
    if (this_00 != (MixedArena *)0x0) {
      ~MixedArena(this_00);
      operator_delete(this_00,0x30);
    }
  } while( true );
}

Assistant:

void* allocSpace(size_t size, size_t align) {
    // the bump allocator data should not be modified by multiple threads at
    // once.
    auto myId = std::this_thread::get_id();
    if (myId != threadId) {
      MixedArena* curr = this;
      MixedArena* allocated = nullptr;
      while (myId != curr->threadId) {
        auto seen = curr->next.load();
        if (seen) {
          curr = seen;
          continue;
        }
        // there is a nullptr for next, so we may be able to place a new
        // allocator for us there. but carefully, as others may do so as
        // well. we may waste a few allocations here, but it doesn't matter
        // as this can only happen as the chain is built up, i.e.,
        // O(# of cores) per allocator, and our allocatrs are long-lived.
        if (!allocated) {
          allocated = new MixedArena(); // has our thread id
        }
        if (curr->next.compare_exchange_strong(seen, allocated)) {
          // we replaced it, so we are the next in the chain
          // we can forget about allocated, it is owned by the chain now
          allocated = nullptr;
          break;
        }
        // otherwise, the cmpxchg updated seen, and we continue to loop
        curr = seen;
      }
      if (allocated) {
        delete allocated;
      }
      return curr->allocSpace(size, align);
    }
    // First, move the current index in the last chunk to an aligned position.
    index = (index + align - 1) & (-align);
    if (index + size > CHUNK_SIZE || chunks.size() == 0) {
      // Allocate a new chunk.
      auto numChunks = (size + CHUNK_SIZE - 1) / CHUNK_SIZE;
      assert(size <= numChunks * CHUNK_SIZE);
      auto* allocation =
        wasm::aligned_malloc(MAX_ALIGN, numChunks * CHUNK_SIZE);
      if (!allocation) {
        abort();
      }
      chunks.push_back(allocation);
      index = 0;
    }
    uint8_t* ret = static_cast<uint8_t*>(chunks.back());
    ret += index;
    index += size; // TODO: if we allocated more than 1 chunk, reuse the
                   // remainder, right now we allocate another next time
    return static_cast<void*>(ret);
  }